

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

string * __thiscall
argparse::Argument::get_usage_full_abi_cxx11_(string *__return_storage_ptr__,Argument *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  string metavar;
  stringstream usage;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  get_names_csv_abi_cxx11_(&local_1c8,this,'/');
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  paVar1 = &local_1c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  sVar2 = (this->m_metavar)._M_string_length;
  local_1c8._M_dataplus._M_p = (pointer)paVar1;
  if (sVar2 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"VAR","");
  }
  else {
    pcVar3 = (this->m_metavar)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1c8,pcVar3,pcVar3 + sVar2);
  }
  if ((this->m_num_args_range).m_max != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_198," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    if (1 < (this->m_num_args_range).m_max) {
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"...",3);
    }
  }
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string get_usage_full() const {
    std::stringstream usage;

    usage << get_names_csv('/');
    const std::string metavar = !m_metavar.empty() ? m_metavar : "VAR";
    if (m_num_args_range.get_max() > 0) {
      usage << " " << metavar;
      if (m_num_args_range.get_max() > 1) {
        usage << "...";
      }
    }
    return usage.str();
  }